

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_pos_in_bounds(lws *wsi)

{
  uint uVar1;
  uint uVar2;
  allocated_headers *paVar3;
  int iVar4;
  
  paVar3 = (wsi->http).ah;
  if (paVar3 == (allocated_headers *)0x0) {
    iVar4 = -1;
  }
  else {
    uVar1 = paVar3->pos;
    uVar2 = ((wsi->a).context)->max_http_header_data;
    iVar4 = 0;
    if (uVar2 <= uVar1) {
      if ((int)uVar1 < (int)(uVar2 - 1)) {
        _lws_log(1,"%s: pos %ld, limit %ld\n","lws_pos_in_bounds");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                      ,0x2af,"int lws_pos_in_bounds(struct lws *)");
      }
      iVar4 = 1;
      _lws_log(1,"Ran out of header data space\n");
    }
  }
  return iVar4;
}

Assistant:

static int LWS_WARN_UNUSED_RESULT
lws_pos_in_bounds(struct lws *wsi)
{
	if (!wsi->http.ah)
		return -1;

	if (wsi->http.ah->pos <
	    (unsigned int)wsi->a.context->max_http_header_data)
		return 0;

	if ((int)wsi->http.ah->pos >= (int)wsi->a.context->max_http_header_data - 1) {
		lwsl_err("Ran out of header data space\n");
		return 1;
	}

	/*
	 * with these tests everywhere, it should never be able to exceed
	 * the limit, only meet it
	 */
	lwsl_err("%s: pos %ld, limit %ld\n", __func__,
		 (unsigned long)wsi->http.ah->pos,
		 (unsigned long)wsi->a.context->max_http_header_data);
	assert(0);

	return 1;
}